

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

bool slang::ast::AssertionExpr::checkAssertionCall
               (CallExpression *call,ASTContext *context,DiagCode outArgCode,DiagCode refArgCode,
               optional<slang::DiagCode> sysTaskCode,SourceRange range)

{
  ArgList *pAVar1;
  DiagCode code;
  bool bVar2;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *this;
  SystemSubroutine *pSVar3;
  DiagCode *pDVar4;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar5;
  iterator ppFVar6;
  Diagnostic *pDVar7;
  ArgList *pAVar8;
  reference ppEVar9;
  Symbol *this_00;
  VariableSymbol *pVVar10;
  Diagnostic *this_01;
  Diagnostic *diag_1;
  Symbol *sym;
  Diagnostic *diag;
  FormalArgumentSymbol **formal;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *local_88;
  ArgList *__range3;
  size_t index;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args;
  SubroutineSymbol *sub_1;
  SystemSubroutine *sub;
  ASTContext *context_local;
  CallExpression *call_local;
  optional<slang::DiagCode> sysTaskCode_local;
  DiagCode refArgCode_local;
  DiagCode outArgCode_local;
  
  call_local._0_4_ =
       sysTaskCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
       super__Optional_payload_base<slang::DiagCode>._M_payload;
  call_local._4_2_ =
       sysTaskCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
       super__Optional_payload_base<slang::DiagCode>._4_2_;
  unique0x1000044f = refArgCode;
  sysTaskCode_local.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
  super__Optional_payload_base<slang::DiagCode>._2_4_ = outArgCode;
  bVar2 = CallExpression::isSystemCall(call);
  if (bVar2) {
    this = std::
           get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                     (&call->subroutine);
    pSVar3 = not_null<const_slang::ast::SystemSubroutine_*>::operator*(&this->subroutine);
    if ((pSVar3->kind == Function) &&
       (bVar2 = std::optional::operator_cast_to_bool((optional *)&call_local), bVar2)) {
      pDVar4 = std::optional<slang::DiagCode>::operator*((optional<slang::DiagCode> *)&call_local);
      ASTContext::addDiag(context,*pDVar4,range);
      return false;
    }
    if ((pSVar3->hasOutputArgs & 1U) != 0) {
      ASTContext::addDiag(context,(DiagCode)
                                  sysTaskCode_local.
                                  super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                                  super__Optional_payload_base<slang::DiagCode>._2_4_,range);
      return false;
    }
  }
  else {
    ppSVar5 = std::
              get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                        (&call->subroutine);
    args.size_ = (size_type)*ppSVar5;
    _index = CallExpression::arguments(call);
    __range3 = (ArgList *)0x0;
    ___begin3 = SubroutineSymbol::getArguments((SubroutineSymbol *)args.size_);
    local_88 = (span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
               &__begin3;
    __end3 = nonstd::span_lite::
             span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                       (local_88);
    ppFVar6 = nonstd::span_lite::
              span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                        (local_88);
    for (; pAVar1 = __range3, __end3 != ppFVar6; __end3 = __end3 + 1) {
      if (((*__end3)->direction == Out) || ((*__end3)->direction == InOut)) {
        pDVar7 = ASTContext::addDiag(context,(DiagCode)
                                             sysTaskCode_local.
                                             super__Optional_base<slang::DiagCode,_true,_true>.
                                             _M_payload.
                                             super__Optional_payload_base<slang::DiagCode>._2_4_,
                                     range);
        Diagnostic::addNote(pDVar7,(DiagCode)0x40001,
                            ((*__end3)->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                            location);
        return false;
      }
      if ((*__end3)->direction == Ref) {
        pAVar8 = (ArgList *)
                 nonstd::span_lite::
                 span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                           ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                            &index);
        if (pAVar8 <= pAVar1) {
          assert::assertFailed
                    ("index < args.size()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
                     ,0x11e,
                     "static bool slang::ast::AssertionExpr::checkAssertionCall(const CallExpression &, const ASTContext &, DiagCode, DiagCode, std::optional<DiagCode>, SourceRange)"
                    );
        }
        ppEVar9 = nonstd::span_lite::
                  span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             &index,(size_type)__range3);
        this_00 = Expression::getSymbolReference(*ppEVar9,true);
        if (((this_00 != (Symbol *)0x0) && (bVar2 = VariableSymbol::isKind(this_00->kind), bVar2))
           && (pVVar10 = Symbol::as<slang::ast::VariableSymbol>(this_00),
              code = stack0xffffffffffffffee, pVVar10->lifetime == Automatic)) {
          ppEVar9 = nonstd::span_lite::
                    span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                               &index,(size_type)__range3);
          pDVar7 = ASTContext::addDiag(context,code,(*ppEVar9)->sourceRange);
          this_01 = Diagnostic::operator<<(pDVar7,this_00->name);
          Diagnostic::operator<<
                    (this_01,((*__end3)->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
          Diagnostic::addNote(pDVar7,(DiagCode)0x40001,this_00->location);
          return false;
        }
      }
      __range3 = (ArgList *)((long)&__range3->data_ + 1);
    }
  }
  return true;
}

Assistant:

bool AssertionExpr::checkAssertionCall(const CallExpression& call, const ASTContext& context,
                                       DiagCode outArgCode, DiagCode refArgCode,
                                       std::optional<DiagCode> sysTaskCode, SourceRange range) {
    if (call.isSystemCall()) {
        auto& sub = *std::get<1>(call.subroutine).subroutine;
        if (sub.kind == SubroutineKind::Function && sysTaskCode) {
            context.addDiag(*sysTaskCode, range);
            return false;
        }

        if (sub.hasOutputArgs) {
            context.addDiag(outArgCode, range);
            return false;
        }
    }
    else {
        auto& sub = *std::get<0>(call.subroutine);
        auto args = call.arguments();
        size_t index = 0;
        for (auto& formal : sub.getArguments()) {
            if (formal->direction == ArgumentDirection::Out ||
                formal->direction == ArgumentDirection::InOut) {
                auto& diag = context.addDiag(outArgCode, range);
                diag.addNote(diag::NoteDeclarationHere, formal->location);
                return false;
            }

            if (formal->direction == ArgumentDirection::Ref) {
                ASSERT(index < args.size());
                if (auto sym = args[index]->getSymbolReference()) {
                    if (VariableSymbol::isKind(sym->kind) &&
                        sym->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                        auto& diag = context.addDiag(refArgCode, args[index]->sourceRange);
                        diag << sym->name << formal->name;
                        diag.addNote(diag::NoteDeclarationHere, sym->location);
                        return false;
                    }
                }
            }

            index++;
        }
    }

    return true;
}